

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O2

_Bool ts_are_copies(TCGTemp *ts1,TCGTemp *ts2)

{
  TCGTemp *pTVar1;
  _Bool _Var2;
  
  if (ts1 != ts2) {
    pTVar1 = *(TCGTemp **)((long)ts1->state_ptr + 0x10);
    if ((pTVar1 == ts1) || (*(TCGTemp **)((long)ts2->state_ptr + 0x10) == ts2)) {
      _Var2 = false;
    }
    else {
      for (; (_Var2 = pTVar1 != ts1, pTVar1 != ts2 && (pTVar1 != ts1));
          pTVar1 = *(TCGTemp **)((long)pTVar1->state_ptr + 0x10)) {
      }
    }
    return _Var2;
  }
  return true;
}

Assistant:

static bool ts_are_copies(TCGTemp *ts1, TCGTemp *ts2)
{
    TCGTemp *i;

    if (ts1 == ts2) {
        return true;
    }

    if (!ts_is_copy(ts1) || !ts_is_copy(ts2)) {
        return false;
    }

    for (i = ts_info(ts1)->next_copy; i != ts1; i = ts_info(i)->next_copy) {
        if (i == ts2) {
            return true;
        }
    }

    return false;
}